

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O3

void icu_63::DateFormatSymbols::assignArray
               (UnicodeString **dstArray,int32_t *dstCount,UnicodeString *srcArray,int32_t srcCount)

{
  long *plVar1;
  UMemory *this;
  long lVar2;
  long lVar3;
  
  *dstCount = srcCount;
  lVar2 = (long)(int)(srcCount + (uint)(srcCount == 0));
  lVar3 = lVar2 * 0x40;
  this = (UMemory *)0xffffffffffffffff;
  if (-1 < srcCount) {
    this = (UMemory *)(lVar3 + 8);
  }
  plVar1 = (long *)UMemory::operator_new__(this,(size_t)dstCount);
  if (plVar1 == (long *)0x0) {
    *dstArray = (UnicodeString *)0x0;
  }
  else {
    *plVar1 = lVar2;
    lVar2 = 0;
    do {
      *(undefined ***)((long)plVar1 + lVar2 + 8) = &PTR__UnicodeString_00487e70;
      *(undefined2 *)((long)plVar1 + lVar2 + 0x10) = 2;
      lVar2 = lVar2 + 0x40;
    } while (lVar3 != lVar2);
    *dstArray = (UnicodeString *)(plVar1 + 1);
    if (0 < srcCount) {
      lVar2 = 0;
      do {
        icu_63::UnicodeString::fastCopyFrom
                  ((UnicodeString *)
                   ((long)&((*dstArray)->super_Replaceable).super_UObject._vptr_UObject + lVar2),
                   (UnicodeString *)
                   ((long)&(srcArray->super_Replaceable).super_UObject._vptr_UObject + lVar2));
        lVar2 = lVar2 + 0x40;
      } while ((ulong)(uint)srcCount << 6 != lVar2);
    }
  }
  return;
}

Assistant:

void
DateFormatSymbols::assignArray(UnicodeString*& dstArray,
                               int32_t& dstCount,
                               const UnicodeString* srcArray,
                               int32_t srcCount)
{
    // assignArray() is only called by copyData() and initializeData(), which in turn
    // implements the copy constructor and the assignment operator.
    // All strings in a DateFormatSymbols object are created in one of the following
    // three ways that all allow to safely use UnicodeString::fastCopyFrom():
    // - readonly-aliases from resource bundles
    // - readonly-aliases or allocated strings from constants
    // - safely cloned strings (with owned buffers) from setXYZ() functions
    //
    // Note that this is true for as long as DateFormatSymbols can be constructed
    // only from a locale bundle or set via the cloning API,
    // *and* for as long as all the strings are in *private* fields, preventing
    // a subclass from creating these strings in an "unsafe" way (with respect to fastCopyFrom()).
    dstCount = srcCount;
    dstArray = newUnicodeStringArray(srcCount);
    if(dstArray != NULL) {
        int32_t i;
        for(i=0; i<srcCount; ++i) {
            dstArray[i].fastCopyFrom(srcArray[i]);
        }
    }
}